

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O0

void __thiscall
SharedMutexTest_Lock_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>::
SharedMutexTest_Lock_Test
          (SharedMutexTest_Lock_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
           *this)

{
  SharedMutexTest_Lock_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
  *this_local;
  
  SharedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>::
  SharedMutexTest(&this->
                   super_SharedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>
                 );
  (this->super_SharedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::PhaseFairness>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__SharedMutexTest_Lock_Test_00448708;
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, Lock)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  std::atomic<int> nread = {};
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-thread
        ph.await();     // p1
        EXPECT_NO_THROW(mtx.lock());
        EXPECT_EQ(TEST_READER_THREADS, nread);
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ASSERT_NO_THROW(mtx.lock_shared());
        ph.advance(1);  // p1
        ++nread;
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}